

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrasterizer.cpp
# Opt level: O2

void __thiscall
QScanConverter::mergeIntersection(QScanConverter *this,Intersection *it,Intersection *isect)

{
  int iVar1;
  int iVar2;
  Intersection *pIVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  
  iVar5 = isect->x;
  do {
    iVar1 = it->x;
    if (iVar5 == iVar1) {
      iVar5 = isect->winding;
      piVar6 = &it->winding;
LAB_003ce9e6:
      *piVar6 = *piVar6 + iVar5;
      return;
    }
    if ((long)(&it->left)[iVar1 <= iVar5] == 0) {
      pIVar3 = this->m_intersections;
      iVar2 = this->m_size;
      piVar6 = &this->m_size;
      (&it->left)[iVar1 <= iVar5] =
           (int)((ulong)((long)pIVar3 + ((long)iVar2 * 0x10 - (long)it)) >> 4);
      iVar5 = isect->winding;
      iVar1 = isect->left;
      iVar4 = isect->right;
      pIVar3 = pIVar3 + iVar2;
      pIVar3->x = isect->x;
      pIVar3->winding = iVar5;
      pIVar3->left = iVar1;
      pIVar3->right = iVar4;
      iVar5 = 1;
      goto LAB_003ce9e6;
    }
    it = it + (&it->left)[iVar1 <= iVar5];
  } while( true );
}

Assistant:

inline void QScanConverter::mergeIntersection(Intersection *it, const Intersection &isect)
{
    Intersection *current = it;

    while (isect.x != current->x) {
        int &next = isect.x < current->x ? current->left : current->right;
        if (next)
            current += next;
        else {
            Intersection *last = m_intersections + m_size;
            next = last - current;
            *last = isect;
            ++m_size;
            return;
        }
    }

    current->winding += isect.winding;
}